

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void SetClipboardTextFn_DefaultImpl(char *text)

{
  int *piVar1;
  ImGuiContext *pIVar2;
  ImGuiContext *pIVar3;
  size_t __n;
  char *pcVar4;
  
  pIVar2 = GImGui;
  pcVar4 = GImGui->PrivateClipboard;
  if (pcVar4 != (char *)0x0) {
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + -1;
    (*(pIVar2->IO).MemFreeFn)(pcVar4);
    pIVar2->PrivateClipboard = (char *)0x0;
  }
  pIVar3 = GImGui;
  __n = strlen(text);
  piVar1 = &(pIVar3->IO).MetricsAllocs;
  *piVar1 = *piVar1 + 1;
  pcVar4 = (char *)(*(pIVar3->IO).MemAllocFn)(__n + 1);
  pIVar2->PrivateClipboard = pcVar4;
  memcpy(pcVar4,text,__n);
  pIVar2->PrivateClipboard[(int)__n] = '\0';
  return;
}

Assistant:

static void SetClipboardTextFn_DefaultImpl(const char* text)
{
    ImGuiContext& g = *GImGui;
    if (g.PrivateClipboard)
    {
        ImGui::MemFree(g.PrivateClipboard);
        g.PrivateClipboard = NULL;
    }
    const char* text_end = text + strlen(text);
    g.PrivateClipboard = (char*)ImGui::MemAlloc((size_t)(text_end - text) + 1);
    memcpy(g.PrivateClipboard, text, (size_t)(text_end - text));
    g.PrivateClipboard[(int)(text_end - text)] = 0;
}